

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O0

MDDEntry * __thiscall ASDCP::Dictionary::MutableType(Dictionary *this,MDD_t type_id)

{
  bool bVar1;
  ILogSink *this_00;
  _Self local_30;
  MDD_t local_24;
  _Self local_20;
  iterator rii;
  MDD_t type_id_local;
  Dictionary *this_local;
  
  rii._M_node._4_4_ = type_id;
  if (*this->m_MDD_Table[0].name == '\0') {
    __assert_fail("m_MDD_Table[0].name[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                  ,0x123,"ASDCP::MDDEntry &ASDCP::Dictionary::MutableType(MDD_t)");
  }
  local_24 = type_id;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_ASDCP::UL,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ASDCP::UL>_>_>
       ::find(&this->m_md_rev_lookup,&local_24);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_ASDCP::UL,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ASDCP::UL>_>_>
       ::end(&this->m_md_rev_lookup);
  bVar1 = std::operator==(&local_20,&local_30);
  if (bVar1) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Warn(this_00,"UL Dictionary: unknown UL type_id: %d\n",(ulong)rii._M_node._4_4_)
    ;
  }
  return this->m_MDD_Table + rii._M_node._4_4_;
}

Assistant:

ASDCP::MDDEntry&
ASDCP::Dictionary::MutableType(MDD_t type_id)
{
  assert(m_MDD_Table[0].name[0]);
  std::map<ui32_t, ASDCP::UL>::iterator rii = m_md_rev_lookup.find(type_id);

  if ( rii == m_md_rev_lookup.end() )
    Kumu::DefaultLogSink().Warn("UL Dictionary: unknown UL type_id: %d\n", type_id);

  return m_MDD_Table[type_id];
}